

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O1

void __thiscall
pbrt::BVHBuildNode::InitInterior(BVHBuildNode *this,int axis,BVHBuildNode *c0,BVHBuildNode *c1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar5;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  this->children[0] = c0;
  this->children[1] = c1;
  uVar1 = (c1->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
  uVar6 = (c1->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
  auVar12._4_4_ = uVar6;
  auVar12._0_4_ = uVar1;
  auVar12._8_8_ = 0;
  uVar2 = (c0->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
  uVar7 = (c0->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
  auVar13._4_4_ = uVar7;
  auVar13._0_4_ = uVar2;
  auVar13._8_8_ = 0;
  auVar10 = vminps_avx(auVar12,auVar13);
  uVar3 = (c0->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
  uVar8 = (c0->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
  auVar14._4_4_ = uVar8;
  auVar14._0_4_ = uVar3;
  auVar14._8_8_ = 0;
  auVar11 = vminss_avx(ZEXT416((uint)(c1->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z),
                       ZEXT416((uint)(c0->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z));
  uVar4 = (c1->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
  uVar9 = (c1->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
  auVar15._4_4_ = uVar9;
  auVar15._0_4_ = uVar4;
  auVar15._8_8_ = 0;
  auVar12 = vmaxps_avx(auVar15,auVar14);
  auVar13 = vmaxss_avx(ZEXT416((uint)(c1->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z),
                       ZEXT416((uint)(c0->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z));
  uVar5 = vmovlps_avx(auVar10);
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar5;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar5 >> 0x20);
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar11._0_4_;
  uVar5 = vmovlps_avx(auVar12);
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar5;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar5 >> 0x20);
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar13._0_4_;
  this->splitAxis = axis;
  this->nPrimitives = 0;
  *(long *)(in_FS_OFFSET + -0x2e8) = *(long *)(in_FS_OFFSET + -0x2e8) + 1;
  return;
}

Assistant:

void InitInterior(int axis, BVHBuildNode *c0, BVHBuildNode *c1) {
        children[0] = c0;
        children[1] = c1;
        bounds = Union(c0->bounds, c1->bounds);
        splitAxis = axis;
        nPrimitives = 0;
        ++interiorNodes;
    }